

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O2

bool __thiscall wasm::RemoveUnusedBrs::sinkBlocks(RemoveUnusedBrs *this,Function *func)

{
  char cVar1;
  ReFinalize local_270;
  undefined1 auStack_108 [8];
  Sinker sinker;
  
  auStack_108 = (undefined1  [8])0x0;
  sinker.super_PostWalker<Sinker,_wasm::Visitor<Sinker,_void>_>.
  super_Walker<Sinker,_wasm::Visitor<Sinker,_void>_>.replacep = (Expression **)0x0;
  sinker.super_PostWalker<Sinker,_wasm::Visitor<Sinker,_void>_>.
  super_Walker<Sinker,_wasm::Visitor<Sinker,_void>_>.stack.fixed._M_elems[9].currp =
       (Expression **)0x0;
  sinker.super_PostWalker<Sinker,_wasm::Visitor<Sinker,_void>_>.
  super_Walker<Sinker,_wasm::Visitor<Sinker,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::Task,_std::allocator<wasm::Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sinker.super_PostWalker<Sinker,_wasm::Visitor<Sinker,_void>_>.
  super_Walker<Sinker,_wasm::Visitor<Sinker,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::Task,_std::allocator<wasm::Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sinker.super_PostWalker<Sinker,_wasm::Visitor<Sinker,_void>_>.
  super_Walker<Sinker,_wasm::Visitor<Sinker,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::Task,_std::allocator<wasm::Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  sinker.super_PostWalker<Sinker,_wasm::Visitor<Sinker,_void>_>.
  super_Walker<Sinker,_wasm::Visitor<Sinker,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::Task,_std::allocator<wasm::Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  sinker.super_PostWalker<Sinker,_wasm::Visitor<Sinker,_void>_>.
  super_Walker<Sinker,_wasm::Visitor<Sinker,_void>_>.currFunction._0_1_ = 0;
  sinker.super_PostWalker<Sinker,_wasm::Visitor<Sinker,_void>_>.
  super_Walker<Sinker,_wasm::Visitor<Sinker,_void>_>._201_8_ = 0;
  Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::walk
            ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)auStack_108,&func->body);
  cVar1 = (char)sinker.super_PostWalker<Sinker,_wasm::Visitor<Sinker,_void>_>.
                super_Walker<Sinker,_wasm::Visitor<Sinker,_void>_>.currModule;
  if ((char)sinker.super_PostWalker<Sinker,_wasm::Visitor<Sinker,_void>_>.
            super_Walker<Sinker,_wasm::Visitor<Sinker,_void>_>.currModule == '\x01') {
    ReFinalize::ReFinalize(&local_270);
    Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walkFunctionInModule
              (&local_270.
                super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                .
                super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                .super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,
               func,(this->
                    super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                    ).
                    super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                    .
                    super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                    .currModule);
    ReFinalize::~ReFinalize(&local_270);
  }
  std::
  _Vector_base<wasm::Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::Task,_std::allocator<wasm::Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::Task>_>
  ::~_Vector_base((_Vector_base<wasm::Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::Task,_std::allocator<wasm::Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::Task>_>
                   *)((long)(sinker.super_PostWalker<Sinker,_wasm::Visitor<Sinker,_void>_>.
                             super_Walker<Sinker,_wasm::Visitor<Sinker,_void>_>.stack.fixed._M_elems
                            + 9) + 8));
  return (bool)cVar1;
}

Assistant:

bool sinkBlocks(Function* func) {
    struct Sinker : public PostWalker<Sinker> {
      bool worked = false;

      void visitBlock(Block* curr) {
        // If the block has a single child which is a loop, and the block is
        // named, then it is the exit for the loop. It's better to move it into
        // the loop, where it can be better optimized by other passes. Similar
        // logic for ifs: if the block is an exit for the if, we can move the
        // block in, consider for example:
        //    (block $label
        //     (if (..condition1..)
        //      (block
        //       (br_if $label (..condition2..))
        //       (..code..)
        //      )
        //     )
        //    )
        // After also merging the blocks, we have
        //    (if (..condition1..)
        //     (block $label
        //      (br_if $label (..condition2..))
        //      (..code..)
        //     )
        //    )
        // which can be further optimized later.
        if (curr->name.is() && curr->list.size() == 1) {
          if (auto* loop = curr->list[0]->dynCast<Loop>()) {
            curr->list[0] = loop->body;
            loop->body = curr;
            curr->finalize(curr->type);
            loop->finalize();
            replaceCurrent(loop);
            worked = true;
          } else if (auto* iff = curr->list[0]->dynCast<If>()) {
            if (iff->condition->type == Type::unreachable) {
              // The block result type may not be compatible with the arm result
              // types since the unreachable If can satisfy any type of block.
              // Just leave this for DCE.
              return;
            }
            // The label can't be used in the condition.
            if (BranchUtils::BranchSeeker::count(iff->condition, curr->name) ==
                0) {
              // We can move the block into either arm, if there are no uses in
              // the other.
              Expression** target = nullptr;
              if (!iff->ifFalse || BranchUtils::BranchSeeker::count(
                                     iff->ifFalse, curr->name) == 0) {
                target = &iff->ifTrue;
              } else if (BranchUtils::BranchSeeker::count(iff->ifTrue,
                                                          curr->name) == 0) {
                target = &iff->ifFalse;
              }
              if (target) {
                curr->list[0] = *target;
                *target = curr;
                // The block used to contain the if, and may have changed type
                // from unreachable to none, for example, if the if has an
                // unreachable condition but the arm is not unreachable.
                curr->finalize();
                iff->finalize();
                replaceCurrent(iff);
                worked = true;
                // Note that the type might change, e.g. if the if condition is
                // unreachable but the block that was on the outside had a
                // break.
              }
            }
          }
        }
      }
    } sinker;

    sinker.doWalkFunction(func);
    if (sinker.worked) {
      ReFinalize().walkFunctionInModule(func, getModule());
      return true;
    }
    return false;
  }